

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TreeNodeUpdateNextOpen(ImGuiID storage_id,ImGuiTreeNodeFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiStorage *this;
  ImGuiContext *pIVar2;
  int iVar3;
  uint in_ESI;
  byte bVar4;
  int stored_value;
  bool is_open;
  ImGuiStorage *storage;
  ImGuiWindow *window;
  ImGuiContext *g;
  int in_stack_ffffffffffffffd0;
  ImGuiID in_stack_ffffffffffffffd4;
  uint uVar5;
  bool local_1;
  
  pIVar2 = GImGui;
  if ((in_ESI & 0x100) == 0) {
    pIVar1 = GImGui->CurrentWindow;
    this = (pIVar1->DC).StateStorage;
    if (((GImGui->NextItemData).Flags & 2U) == 0) {
      iVar3 = ImGuiStorage::GetInt(this,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
      bVar4 = iVar3 != 0;
    }
    else if (((GImGui->NextItemData).OpenCond & 1) == 0) {
      iVar3 = ImGuiStorage::GetInt(this,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
      if (iVar3 == -1) {
        uVar5 = CONCAT13((pIVar2->NextItemData).OpenVal,(int3)in_stack_ffffffffffffffd4) & 0x1ffffff
        ;
        TreeNodeSetOpen(uVar5,true);
        bVar4 = (byte)(uVar5 >> 0x18);
      }
      else {
        bVar4 = iVar3 != 0;
      }
    }
    else {
      uVar5 = CONCAT13((GImGui->NextItemData).OpenVal,(int3)in_stack_ffffffffffffffd4) & 0x1ffffff;
      TreeNodeSetOpen(uVar5,SUB41((uint)in_stack_ffffffffffffffd0 >> 0x18,0));
      bVar4 = (byte)(uVar5 >> 0x18);
    }
    if ((((pIVar2->LogEnabled & 1U) != 0) && ((in_ESI & 0x10) == 0)) &&
       ((pIVar1->DC).TreeDepth - pIVar2->LogDepthRef < pIVar2->LogDepthToExpand)) {
      bVar4 = 1;
    }
    local_1 = (bool)(bVar4 & 1);
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ImGui::TreeNodeUpdateNextOpen(ImGuiID storage_id, ImGuiTreeNodeFlags flags)
{
    if (flags & ImGuiTreeNodeFlags_Leaf)
        return true;

    // We only write to the tree storage if the user clicks, or explicitly use the SetNextItemOpen function
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStorage* storage = window->DC.StateStorage;

    bool is_open;
    if (g.NextItemData.Flags & ImGuiNextItemDataFlags_HasOpen)
    {
        if (g.NextItemData.OpenCond & ImGuiCond_Always)
        {
            is_open = g.NextItemData.OpenVal;
            TreeNodeSetOpen(storage_id, is_open);
        }
        else
        {
            // We treat ImGuiCond_Once and ImGuiCond_FirstUseEver the same because tree node state are not saved persistently.
            const int stored_value = storage->GetInt(storage_id, -1);
            if (stored_value == -1)
            {
                is_open = g.NextItemData.OpenVal;
                TreeNodeSetOpen(storage_id, is_open);
            }
            else
            {
                is_open = stored_value != 0;
            }
        }
    }
    else
    {
        is_open = storage->GetInt(storage_id, (flags & ImGuiTreeNodeFlags_DefaultOpen) ? 1 : 0) != 0;
    }

    // When logging is enabled, we automatically expand tree nodes (but *NOT* collapsing headers.. seems like sensible behavior).
    // NB- If we are above max depth we still allow manually opened nodes to be logged.
    if (g.LogEnabled && !(flags & ImGuiTreeNodeFlags_NoAutoOpenOnLog) && (window->DC.TreeDepth - g.LogDepthRef) < g.LogDepthToExpand)
        is_open = true;

    return is_open;
}